

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManComputeDelay(Sbl_Man_t *p,int iLut,Vec_Int_t *vFanins)

{
  int iVar1;
  int local_2c;
  int Delay;
  int iFan;
  int k;
  Vec_Int_t *vFanins_local;
  int iLut_local;
  Sbl_Man_t *p_local;
  
  local_2c = 0;
  for (Delay = 0; iVar1 = Vec_IntSize(vFanins), Delay < iVar1; Delay = Delay + 1) {
    iVar1 = Vec_IntEntry(vFanins,Delay);
    iVar1 = Vec_IntEntry(p->vArrs,iVar1);
    local_2c = Abc_MaxInt(local_2c,iVar1 + 1);
  }
  return local_2c;
}

Assistant:

int Sbl_ManComputeDelay( Sbl_Man_t * p, int iLut, Vec_Int_t * vFanins )
{
    int k, iFan, Delay = 0;
    Vec_IntForEachEntry( vFanins, iFan, k )
        Delay = Abc_MaxInt( Delay, Vec_IntEntry(p->vArrs, iFan) + 1 );
    return Delay;
}